

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::
CopyMessageTest_ArenaEnabledCopyConstructorNull_Test::
CopyMessageTest_ArenaEnabledCopyConstructorNull_Test
          (CopyMessageTest_ArenaEnabledCopyConstructorNull_Test *this)

{
  CopyMessageTest_ArenaEnabledCopyConstructorNull_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__CopyMessageTest_ArenaEnabledCopyConstructorNull_Test_02a00158;
  return;
}

Assistant:

TEST(CopyMessageTest, ArenaEnabledCopyConstructorNull) {
  proto2_unittest::TestAllTypes message1;
  TestUtil::SetAllFields(&message1);
  proto2_unittest::TestAllTypes* message2 =
      Arena::Create<proto2_unittest::TestAllTypes>(nullptr, message1);
  TestUtil::ExpectAllFieldsSet(*message2);
  delete message2;
}